

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int ARKodeEvolve(void *arkode_mem,sunrealtype tout,N_Vector yout,sunrealtype *tret,int itask)

{
  int *nflagPtr;
  sunrealtype sVar1;
  double t;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  double dVar8;
  undefined8 uVar9;
  double dVar10;
  double dVar11;
  sunrealtype dsm;
  int relax_fails;
  int constrfails;
  int nef;
  int ncf;
  int nflag;
  int local_5c;
  long local_58;
  sunrealtype local_50;
  int local_44 [5];
  
  if (arkode_mem == (void *)0x0) {
    pcVar7 = "arkode_mem = NULL illegal.";
    iVar4 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar5 = -0x15;
    iVar2 = 0x2a3;
LAB_00162b41:
    arkProcessError((ARKodeMem)arkode_mem,iVar5,iVar2,"ARKodeEvolve",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,pcVar7);
    return iVar4;
  }
  if (*(int *)((long)arkode_mem + 0x3c0) == 0) {
    pcVar7 = "Attempt to call before ARKodeInit.";
    iVar4 = -0x17;
    iVar5 = -0x17;
    iVar2 = 0x2ac;
    goto LAB_00162b41;
  }
  *(N_Vector *)((long)arkode_mem + 0x248) = yout;
  if (yout == (N_Vector)0x0) {
    pcVar7 = "yout = NULL illegal.";
    iVar4 = -0x16;
    iVar5 = -0x16;
    iVar2 = 0x2b4;
    goto LAB_00162b41;
  }
  if (tret == (sunrealtype *)0x0) {
    pcVar7 = "tret = NULL illegal.";
    iVar4 = -0x16;
    iVar5 = -0x16;
    iVar2 = 700;
    goto LAB_00162b41;
  }
  if (itask - 3U < 0xfffffffe) {
    pcVar7 = "Illegal value for itask.";
    iVar4 = -0x16;
    iVar5 = -0x16;
    iVar2 = 0x2c4;
    goto LAB_00162b41;
  }
  lVar3 = *(long *)((long)arkode_mem + 0x3d8);
  if (lVar3 != 0) {
    if (itask == 1) {
      *(sunrealtype *)(lVar3 + 0x50) = tout;
    }
    *(int *)(lVar3 + 0x60) = itask;
  }
  iVar2 = local_5c;
  if (*(int *)((long)arkode_mem + 0x3c4) != 0) {
    sVar1 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
    *tret = sVar1;
    *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar1;
    iVar2 = arkInitialSetup((ARKodeMem)arkode_mem,tout);
    if (iVar2 != 0) {
      return iVar2;
    }
    local_5c = 0;
    iVar2 = 0;
    if (*(int *)((long)arkode_mem + 0x3c4) != 0) goto LAB_00162bda;
  }
  local_5c = iVar2;
  iVar2 = arkStopTests((ARKodeMem)arkode_mem,tout,yout,tret,itask,&local_5c);
  if (iVar2 != 0) {
    return local_5c;
  }
LAB_00162bda:
  nflagPtr = local_44 + 4;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)arkode_mem + 0x2e0) = *(undefined8 *)((long)arkode_mem + 0x2c0);
    local_58 = lVar3;
    if (*(int *)((long)arkode_mem + 0x3c4) == 0) {
      iVar2 = (**(code **)((long)arkode_mem + 0x58))
                        (*(undefined8 *)((long)arkode_mem + 0x250),
                         *(undefined8 *)((long)arkode_mem + 0x230),
                         *(undefined8 *)((long)arkode_mem + 0x60));
      if (iVar2 != 0) {
        uVar9 = *(undefined8 *)((long)arkode_mem + 0x2f0);
        if (*(int *)((long)arkode_mem + 0x18) == 2) {
          pcVar7 = "At t = %.15g, the user-provide EwtSet function failed.";
          iVar2 = 0x310;
        }
        else {
          pcVar7 = "At t = %.15g, a component of ewt has become <= 0.";
          iVar2 = 0x315;
        }
LAB_001633f1:
        arkProcessError((ARKodeMem)arkode_mem,-0x16,iVar2,"ARKodeEvolve",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                        ,pcVar7,uVar9);
        sVar1 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
        *tret = sVar1;
        *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar1;
        N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
        return -0x16;
      }
      if ((*(int *)((long)arkode_mem + 0x240) == 0) &&
         (iVar2 = (**(code **)((long)arkode_mem + 0x70))
                            (*(undefined8 *)((long)arkode_mem + 0x250),
                             *(undefined8 *)((long)arkode_mem + 0x238),
                             *(undefined8 *)((long)arkode_mem + 0x78)), iVar2 != 0)) {
        uVar9 = *(undefined8 *)((long)arkode_mem + 0x2f0);
        if (*(int *)((long)arkode_mem + 0x18) == 2) {
          pcVar7 = "At t = %.15g, the user-provide RwtSet function failed.";
          iVar2 = 0x326;
        }
        else {
          pcVar7 = "At t = %.15g, a component of rwt has become <= 0.";
          iVar2 = 0x32b;
        }
        goto LAB_001633f1;
      }
    }
    if (*(long *)((long)arkode_mem + 0x310) <= local_58 && 0 < *(long *)((long)arkode_mem + 0x310))
    {
      iVar2 = -1;
      arkProcessError((ARKodeMem)arkode_mem,-1,0x33a,"ARKodeEvolve",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"At t = %.15g, mxstep steps taken before reaching tout.",
                      *(undefined8 *)((long)arkode_mem + 0x2f0));
LAB_00163173:
      sVar1 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
      *tret = sVar1;
      *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar1;
      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
      return iVar2;
    }
    dVar8 = (double)N_VWrmsNorm(*(undefined8 *)((long)arkode_mem + 0x250),
                                *(undefined8 *)((long)arkode_mem + 0x230));
    dVar8 = dVar8 * *(double *)((long)arkode_mem + 8);
    *(double *)((long)arkode_mem + 0x398) = dVar8;
    if ((1.0 < dVar8) && (*(int *)((long)arkode_mem + 0x300) == 0)) {
      arkProcessError((ARKodeMem)arkode_mem,-2,0x347,"ARKodeEvolve",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"At t = %.15g, too much accuracy requested.",
                      *(undefined8 *)((long)arkode_mem + 0x2f0));
      sVar1 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
      *tret = sVar1;
      *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar1;
      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
      *(double *)((long)arkode_mem + 0x398) =
           *(double *)((long)arkode_mem + 0x398) + *(double *)((long)arkode_mem + 0x398);
      return -2;
    }
    *(undefined8 *)((long)arkode_mem + 0x398) = 0x3ff0000000000000;
    dVar8 = *(double *)((long)arkode_mem + 0x2f0);
    dVar10 = dVar8 + *(double *)((long)arkode_mem + 0x2c0);
    if ((dVar10 == dVar8) && (!NAN(dVar10) && !NAN(dVar8))) {
      iVar4 = *(int *)((long)arkode_mem + 0x318);
      iVar5 = *(int *)((long)arkode_mem + 0x338);
      iVar2 = iVar5 + 1;
      *(int *)((long)arkode_mem + 0x338) = iVar2;
      if (iVar5 < iVar4) {
        arkProcessError((ARKodeMem)arkode_mem,99,0x357,"ARKodeEvolve",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                        ,
                        "Internal t = %.15g and h = %.15g are such that t + h = t on the next step. The solver will continue anyway."
                       );
        iVar4 = *(int *)((long)arkode_mem + 0x318);
        iVar2 = *(int *)((long)arkode_mem + 0x338);
      }
      if (iVar2 == iVar4) {
        arkProcessError((ARKodeMem)arkode_mem,99,0x35c,"ARKodeEvolve",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                        ,
                        "The above warning has been issued mxhnil times and will not be issued again for this problem."
                       );
      }
    }
    dVar8 = *(double *)((long)arkode_mem + 0x2c0);
    if ((*(double *)((long)arkode_mem + 0x2d8) != dVar8) ||
       (NAN(*(double *)((long)arkode_mem + 0x2d8)) || NAN(dVar8))) {
      dVar8 = dVar8 * *(double *)((long)arkode_mem + 0x2e8);
      *(double *)((long)arkode_mem + 0x2c0) = dVar8;
      *(double *)((long)arkode_mem + 0x2e0) = dVar8;
    }
    if (*(int *)((long)arkode_mem + 0x300) != 0) {
      dVar8 = *(double *)((long)arkode_mem + 0x2b8);
      *(double *)((long)arkode_mem + 0x2c0) = dVar8;
      *(double *)((long)arkode_mem + 0x2e0) = dVar8;
      if (*(int *)((long)arkode_mem + 0x2a8) != 0) {
        if (0.0 < ((dVar8 + *(double *)((long)arkode_mem + 0x2f0)) -
                  *(double *)((long)arkode_mem + 0x2b0)) * dVar8) {
          *(double *)((long)arkode_mem + 0x2c0) =
               (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) *
               (*(double *)((long)arkode_mem + 0x2b0) - *(double *)((long)arkode_mem + 0x2f0));
        }
      }
    }
    local_50 = 0.0;
    iVar2 = 0;
    *(undefined4 *)((long)arkode_mem + 0x43c) = 0;
    local_44[1] = 0;
    local_44[2] = 0;
    local_44[3] = 0;
    local_44[0] = 0;
    local_44[4] = 6;
    while( true ) {
      if (iVar2 != 0xb) {
        *(long *)((long)arkode_mem + 0x328) = *(long *)((long)arkode_mem + 0x328) + 1;
      }
      iVar2 = (**(code **)((long)arkode_mem + 0xa0))(arkode_mem,&local_50,nflagPtr);
      if (iVar2 < 0) goto LAB_00163167;
      iVar2 = arkCheckConvergence((ARKodeMem)arkode_mem,nflagPtr,local_44 + 3);
      if (((iVar2 < 0) ||
          (((iVar2 == 0 && (*(int *)((long)arkode_mem + 0x3e0) != 0)) &&
           (iVar2 = arkRelax((ARKodeMem)arkode_mem,local_44,&local_50), iVar2 < 0)))) ||
         (((iVar2 == 0 && (*(int *)((long)arkode_mem + 0x80) != 0)) &&
          (iVar2 = arkCheckConstraints((ARKodeMem)arkode_mem,local_44 + 1,nflagPtr), iVar2 < 0))))
      goto LAB_00163167;
      if (*(int *)((long)arkode_mem + 0x300) != 0) break;
      if ((iVar2 == 0) &&
         (iVar2 = arkCheckTemporalError((ARKodeMem)arkode_mem,nflagPtr,local_44 + 2,local_50),
         iVar2 < 0)) goto LAB_00163167;
      if (*(int *)((long)arkode_mem + 0x438) != 0) {
        *(int *)((long)arkode_mem + 0x43c) = iVar2;
        goto LAB_00162f53;
      }
      if (iVar2 == 0) goto LAB_00162f53;
      if (ABS(*(double *)((long)arkode_mem + 0x2c0)) <=
          *(double *)((long)arkode_mem + 0x2c8) * 1.000001) {
        return -3;
      }
      dVar8 = *(double *)((long)arkode_mem + 0x2c0) * *(double *)((long)arkode_mem + 0x2e8);
      *(double *)((long)arkode_mem + 0x2c0) = dVar8;
      *(double *)((long)arkode_mem + 0x2d8) = dVar8;
      *(double *)((long)arkode_mem + 0x2e0) = dVar8;
    }
    *(undefined8 *)((long)arkode_mem + 0x2e8) = 0x3ff0000000000000;
    if (iVar2 != 0) goto LAB_00163167;
LAB_00162f53:
    iVar2 = arkCompleteStep((ARKodeMem)arkode_mem,local_50);
    if (iVar2 != 0) {
LAB_00163167:
      iVar2 = arkHandleFailure((ARKodeMem)arkode_mem,iVar2);
      goto LAB_00163173;
    }
    if ((*(long *)((long)arkode_mem + 0x3d8) != 0) &&
       (0 < *(int *)(*(long *)((long)arkode_mem + 0x3d8) + 8))) {
      iVar2 = arkRootCheck3(arkode_mem);
      if (iVar2 == -0xc) {
        tout = *(sunrealtype *)(*(long *)((long)arkode_mem + 0x3d8) + 0x20);
        pcVar7 = "At t = %.15g, the rootfinding routine failed in an unrecoverable manner.";
        iVar2 = -0xc;
        iVar4 = 0x410;
        goto LAB_00163376;
      }
      if (iVar2 == 1) {
        lVar3 = *(long *)((long)arkode_mem + 0x3d8);
        *(undefined4 *)(lVar3 + 100) = 1;
        sVar1 = *(sunrealtype *)(lVar3 + 0x20);
        *tret = sVar1;
        *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar1;
        return 2;
      }
      if (*(long *)((long)arkode_mem + 0x330) == 1) {
        lVar3 = *(long *)((long)arkode_mem + 0x3d8);
        if (0 < (long)*(int *)(lVar3 + 8)) {
          lVar6 = 0;
          do {
            if (*(int *)(*(long *)(lVar3 + 0x70) + lVar6 * 4) == 0) {
              if (0 < *(int *)(lVar3 + 0x78)) {
                arkProcessError((ARKodeMem)arkode_mem,99,0x427,"ARKodeEvolve",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,
                                "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                               );
              }
              break;
            }
            lVar6 = lVar6 + 1;
          } while (*(int *)(lVar3 + 8) != lVar6);
        }
      }
    }
    if (*(int *)((long)arkode_mem + 0x2a8) != 0) {
      dVar8 = *(double *)((long)arkode_mem + 0x2f0);
      dVar10 = *(double *)((long)arkode_mem + 0x2c0);
      dVar11 = (ABS(dVar10) + ABS(dVar8)) * *(double *)((long)arkode_mem + 8) * 100.0;
      t = *(double *)((long)arkode_mem + 0x2b0);
      if (ABS(dVar8 - t) <= dVar11) {
        if ((0.0 <= dVar10 * (tout - t)) || (ABS(tout - t) <= dVar11)) {
          if ((*(int *)((long)arkode_mem + 0x2ac) == 0) ||
             (*(long *)((long)arkode_mem + 0x298) == 0)) {
            N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
          }
          else {
            iVar2 = ARKodeGetDky(arkode_mem,t,0,yout);
            if (iVar2 != 0) {
              tout = *(sunrealtype *)((long)arkode_mem + 0x2b0);
              pcVar7 = "At t = %.15g, interpolating the solution failed.";
              iVar4 = 0x43f;
              goto LAB_00163376;
            }
          }
          sVar1 = *(sunrealtype *)((long)arkode_mem + 0x2b0);
          *tret = sVar1;
          *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar1;
          *(undefined4 *)((long)arkode_mem + 0x2a8) = 0;
          return 1;
        }
      }
      else if (0.0 < ((*(double *)((long)arkode_mem + 0x2d8) + dVar8) - t) * dVar10) {
        dVar8 = (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) * (t - dVar8);
        *(double *)((long)arkode_mem + 0x2d8) = dVar8;
        *(double *)((long)arkode_mem + 0x2e8) = dVar8 / dVar10;
      }
    }
    lVar3 = local_58 + 1;
    if (itask == 1) {
      if (0.0 <= (*(double *)((long)arkode_mem + 0x2f0) - tout) *
                 *(double *)((long)arkode_mem + 0x2c0)) {
        if (*(long *)((long)arkode_mem + 0x298) == 0) {
          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
          tout = *(sunrealtype *)((long)arkode_mem + 0x2f0);
        }
        else {
          iVar2 = ARKodeGetDky(arkode_mem,tout,0,yout);
          if (iVar2 != 0) {
            pcVar7 = "At t = %.15g, interpolating the solution failed.";
            iVar4 = 0x45e;
LAB_00163376:
            arkProcessError((ARKodeMem)arkode_mem,iVar2,iVar4,"ARKodeEvolve",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,pcVar7,tout);
            return iVar2;
          }
        }
        *tret = tout;
        *(sunrealtype *)((long)arkode_mem + 0x2f8) = tout;
LAB_001634a1:
        *(undefined8 *)((long)arkode_mem + 0x2e0) = *(undefined8 *)((long)arkode_mem + 0x2d8);
        return 0;
      }
    }
    else if (itask == 2) {
      sVar1 = *(sunrealtype *)((long)arkode_mem + 0x2f0);
      *tret = sVar1;
      *(sunrealtype *)((long)arkode_mem + 0x2f8) = sVar1;
      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)arkode_mem + 0x250),yout);
      goto LAB_001634a1;
    }
  } while( true );
}

Assistant:

int ARKodeEvolve(void* arkode_mem, sunrealtype tout, N_Vector yout,
                 sunrealtype* tret, int itask)
{
  long int nstloc;
  int retval, kflag, istate, ir;
  int ewtsetOK;
  sunrealtype troundoff, nrm;
  sunbooleantype inactive_roots;
  sunrealtype dsm;
  int nflag, ncf, nef, constrfails;
  int relax_fails;
  ARKodeMem ark_mem;

  /* used only with debugging logging */
  SUNDIALS_MAYBE_UNUSED int attempts;

  /* Check and process inputs */

  /* Check if ark_mem exists */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Check for yout != NULL */
  if ((ark_mem->ycur = yout) == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_YOUT_NULL);
    return (ARK_ILL_INPUT);
  }

  /* Check for tret != NULL */
  if (tret == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_TRET_NULL);
    return (ARK_ILL_INPUT);
  }

  /* Check for valid itask */
  if ((itask != ARK_NORMAL) && (itask != ARK_ONE_STEP))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_ITASK);
    return (ARK_ILL_INPUT);
  }

  /* start profiler */
  SUNDIALS_MARK_FUNCTION_BEGIN(ARK_PROFILER);

  /* store copy of itask if using root-finding */
  if (ark_mem->root_mem != NULL)
  {
    if (itask == ARK_NORMAL) { ark_mem->root_mem->toutc = tout; }
    ark_mem->root_mem->taskc = itask;
  }

  /* perform first-step-specific initializations:
     - initialize tret values to initialization time
     - perform initial integrator setup  */
  if (ark_mem->initsetup)
  {
    ark_mem->tretlast = *tret = ark_mem->tcur;
    retval                    = arkInitialSetup(ark_mem, tout);
    if (retval != ARK_SUCCESS)
    {
      SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
      return (retval);
    }
  }

  /* perform stopping tests */
  if (!ark_mem->initsetup)
  {
    if (arkStopTests(ark_mem, tout, yout, tret, itask, &retval))
    {
      SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
      return (retval);
    }
  }

  /*--------------------------------------------------
    Looping point for successful internal steps

    - update the ewt/rwt vectors for upcoming step
    - check for errors (too many steps, too much
      accuracy requested, step size too small)
    - loop over attempts at a new step:
      * try to take step (via time stepper module),
        handle solver convergence or other failures
      * if the stepper requests ARK_RETRY_STEP, we
        retry the step without accumulating failures.
        A stepper should never request this multiple
        times in a row.
      * perform constraint-handling (if selected)
      * check temporal error
      * if all of the above pass, complete step by
        updating current time, solution, error &
        stepsize history arrays.
    - perform stop tests:
      * check for root in last step taken
      * check if tout was passed
      * check if close to tstop
      * check if in ONE_STEP mode (must return)
    --------------------------------------------------*/
  nstloc = 0;
  for (;;)
  {
    ark_mem->next_h = ark_mem->h;

    /* Reset and check ewt and rwt */
    if (!ark_mem->initsetup)
    {
      ewtsetOK = ark_mem->efun(ark_mem->yn, ark_mem->ewt, ark_mem->e_data);
      if (ewtsetOK != 0)
      {
        if (ark_mem->itol == ARK_WF)
        {
          arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                          MSG_ARK_EWT_NOW_FAIL, ark_mem->tcur);
        }
        else
        {
          arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                          MSG_ARK_EWT_NOW_BAD, ark_mem->tcur);
        }

        istate            = ARK_ILL_INPUT;
        ark_mem->tretlast = *tret = ark_mem->tcur;
        N_VScale(ONE, ark_mem->yn, yout);
        break;
      }

      if (!ark_mem->rwt_is_ewt)
      {
        ewtsetOK = ark_mem->rfun(ark_mem->yn, ark_mem->rwt, ark_mem->r_data);
        if (ewtsetOK != 0)
        {
          if (ark_mem->itol == ARK_WF)
          {
            arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                            __FILE__, MSG_ARK_RWT_NOW_FAIL, ark_mem->tcur);
          }
          else
          {
            arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                            __FILE__, MSG_ARK_RWT_NOW_BAD, ark_mem->tcur);
          }

          istate            = ARK_ILL_INPUT;
          ark_mem->tretlast = *tret = ark_mem->tcur;
          N_VScale(ONE, ark_mem->yn, yout);
          break;
        }
      }
    }

    /* Check for too many steps */
    if ((ark_mem->mxstep > 0) && (nstloc >= ark_mem->mxstep))
    {
      arkProcessError(ark_mem, ARK_TOO_MUCH_WORK, __LINE__, __func__, __FILE__,
                      MSG_ARK_MAX_STEPS, ark_mem->tcur);
      istate            = ARK_TOO_MUCH_WORK;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    /* Check for too much accuracy requested */
    nrm            = N_VWrmsNorm(ark_mem->yn, ark_mem->ewt);
    ark_mem->tolsf = ark_mem->uround * nrm;
    if (ark_mem->tolsf > ONE && !ark_mem->fixedstep)
    {
      arkProcessError(ark_mem, ARK_TOO_MUCH_ACC, __LINE__, __func__, __FILE__,
                      MSG_ARK_TOO_MUCH_ACC, ark_mem->tcur);
      istate            = ARK_TOO_MUCH_ACC;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->tolsf *= TWO;
      break;
    }
    else { ark_mem->tolsf = ONE; }

    /* Check for h below roundoff level in tn */
    if (ark_mem->tcur + ark_mem->h == ark_mem->tcur)
    {
      ark_mem->nhnil++;
      if (ark_mem->nhnil <= ark_mem->mxhnil)
      {
        arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                        MSG_ARK_HNIL, ark_mem->tcur, ark_mem->h);
      }
      if (ark_mem->nhnil == ark_mem->mxhnil)
      {
        arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                        MSG_ARK_HNIL_DONE);
      }
    }

    /* Update parameter for upcoming step size */
    if (ark_mem->hprime != ark_mem->h)
    {
      ark_mem->h      = ark_mem->h * ark_mem->eta;
      ark_mem->next_h = ark_mem->h;
    }
    if (ark_mem->fixedstep)
    {
      ark_mem->h      = ark_mem->hin;
      ark_mem->next_h = ark_mem->h;

      /* patch for 'fixedstep' + 'tstop' use case:
         limit fixed step size if step would overtake tstop */
      if (ark_mem->tstopset)
      {
        if ((ark_mem->tcur + ark_mem->h - ark_mem->tstop) * ark_mem->h > ZERO)
        {
          ark_mem->h = (ark_mem->tstop - ark_mem->tcur) *
                       (ONE - FOUR * ark_mem->uround);
        }
      }
    }

    /* Looping point for step attempts */
    dsm      = ZERO;
    kflag    = ARK_SUCCESS;
    attempts = ncf = nef = constrfails = ark_mem->last_kflag = 0;
    relax_fails                                              = 0;
    nflag                                                    = FIRST_CALL;
    for (;;)
    {
      /* increment attempt counters
         Note: kflag can only equal ARK_RETRY_STEP if the stepper rejected
         the current step size before performing calculations. Thus, we do
         not include those when keeping track of step "attempts". */
      if (kflag != ARK_RETRY_STEP)
      {
        attempts++;
        ark_mem->nst_attempts++;
      }

      SUNLogInfo(ARK_LOGGER, "begin-step-attempt",
                 "step = %li, tn = " SUN_FORMAT_G ", h = " SUN_FORMAT_G,
                 ark_mem->nst + 1, ark_mem->tn, ark_mem->h);

      /* Call time stepper module to attempt a step:
            0 => step completed successfully
           >0 => step encountered recoverable failure; reduce step if possible
           <0 => step encountered unrecoverable failure */
      kflag = ark_mem->step((void*)ark_mem, &dsm, &nflag);
      if (kflag < 0)
      {
        /* Log fatal errors here, other returns handled below */
        SUNLogInfo(ARK_LOGGER, "end-step-attempt",
                   "status = failed step, kflag = %i", kflag);
        break;
      }

      /* handle solver convergence failures */
      kflag = arkCheckConvergence(ark_mem, &nflag, &ncf);

      SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                   "status = failed step, kflag = %i", kflag);

      if (kflag < 0) { break; }

      /* Perform relaxation:
           - computes relaxation parameter
           - on success, updates ycur, h, and dsm
           - on recoverable failure, updates eta and signals to retry step
           - on fatal error, returns negative error flag */
      if (ark_mem->relax_enabled && (kflag == ARK_SUCCESS))
      {
        kflag = arkRelax(ark_mem, &relax_fails, &dsm);

        SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                     "status = failed relaxtion, kflag = %i", kflag);

        if (kflag < 0) { break; }
      }

      /* perform constraint-handling (if selected, and if solver check passed) */
      if (ark_mem->constraintsSet && (kflag == ARK_SUCCESS))
      {
        kflag = arkCheckConstraints(ark_mem, &constrfails, &nflag);

        SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                     "status = failed constraints, kflag = %i", kflag);

        if (kflag < 0) { break; }
      }

      /* when fixed time-stepping is enabled, 'success' == successful stage solves
         (checked in previous block), so just enforce no step size change */
      if (ark_mem->fixedstep)
      {
        ark_mem->eta = ONE;
        SUNLogInfo(ARK_LOGGER, "end-step-attempt", "status = success");
        break;
      }

      /* check temporal error (if checks above passed) */
      if (kflag == ARK_SUCCESS)
      {
        kflag = arkCheckTemporalError(ark_mem, &nflag, &nef, dsm);

        SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                     "status = failed error test, dsm = " SUN_FORMAT_G
                     ", kflag = %i",
                     dsm, kflag);

        if (kflag < 0) { break; }
      }

      /* if ignoring temporal error test result (XBraid) force step to pass */
      if (ark_mem->force_pass)
      {
        ark_mem->last_kflag = kflag;
        kflag               = ARK_SUCCESS;
        SUNLogInfo(ARK_LOGGER, "end-step-attempt", "status = success");
        break;
      }

      /* break attempt loop on successful step */
      if (kflag == ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-step-attempt",
                   "status = success, dsm = " SUN_FORMAT_G, dsm);
        break;
      }

      /* unsuccessful step, if |h| = hmin, return ARK_ERR_FAILURE */
      if (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM)
      {
        SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
        return (ARK_ERR_FAILURE);
      }

      /* update h, hprime and next_h for next iteration */
      ark_mem->h *= ark_mem->eta;
      ark_mem->next_h = ark_mem->hprime = ark_mem->h;

    } /* end looping for step attempts */

    /* If step attempt loop succeeded, complete step (update current time, solution,
       error stepsize history arrays; call user-supplied step postprocessing function)
       (added stuff from arkStep_PrepareNextStep -- revisit) */
    if (kflag == ARK_SUCCESS) { kflag = arkCompleteStep(ark_mem, dsm); }

    /* If step attempt loop failed, process flag and return to user */
    if (kflag != ARK_SUCCESS)
    {
      istate            = arkHandleFailure(ark_mem, kflag);
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    nstloc++;

    /* Check for root in last step taken. */
    if (ark_mem->root_mem != NULL)
    {
      if (ark_mem->root_mem->nrtfn > 0)
      {
        retval = arkRootCheck3((void*)ark_mem);
        if (retval == RTFOUND)
        { /* A new root was found */
          ark_mem->root_mem->irfnd = 1;
          istate                   = ARK_ROOT_RETURN;
          ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
          break;
        }
        else if (retval == ARK_RTFUNC_FAIL)
        { /* g failed */
          arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                          MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
          istate = ARK_RTFUNC_FAIL;
          break;
        }

        /* If we are at the end of the first step and we still have
           some event functions that are inactive, issue a warning
           as this may indicate a user error in the implementation
           of the root function. */
        if (ark_mem->nst == 1)
        {
          inactive_roots = SUNFALSE;
          for (ir = 0; ir < ark_mem->root_mem->nrtfn; ir++)
          {
            if (!ark_mem->root_mem->gactive[ir])
            {
              inactive_roots = SUNTRUE;
              break;
            }
          }
          if ((ark_mem->root_mem->mxgnull > 0) && inactive_roots)
          {
            arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                            MSG_ARK_INACTIVE_ROOTS);
          }
        }
      }
    }

    /* Check if tn is at tstop or near tstop */
    if (ark_mem->tstopset)
    {
      troundoff = FUZZ_FACTOR * ark_mem->uround *
                  (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

      if (SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
      {
        /* Ensure tout >= tstop, otherwise check for tout return below */
        if ((tout - ark_mem->tstop) * ark_mem->h >= ZERO ||
            SUNRabs(tout - ark_mem->tstop) <= troundoff)
        {
          if (ark_mem->tstopinterp && ark_mem->interp)
          {
            retval = ARKodeGetDky(ark_mem, ark_mem->tstop, 0, yout);
            if (retval != ARK_SUCCESS)
            {
              arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                              MSG_ARK_INTERPOLATION_FAIL, ark_mem->tstop);
              istate = retval;
              break;
            }
          }
          else { N_VScale(ONE, ark_mem->yn, yout); }
          ark_mem->tretlast = *tret = ark_mem->tstop;
          ark_mem->tstopset         = SUNFALSE;
          istate                    = ARK_TSTOP_RETURN;
          break;
        }
      }
      /* limit upcoming step if it will overcome tstop */
      else if ((ark_mem->tcur + ark_mem->hprime - ark_mem->tstop) * ark_mem->h >
               ZERO)
      {
        ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
                          (ONE - FOUR * ark_mem->uround);
        ark_mem->eta = ark_mem->hprime / ark_mem->h;
      }
    }

    /* In NORMAL mode, check if tout reached */
    if ((itask == ARK_NORMAL) && (ark_mem->tcur - tout) * ark_mem->h >= ZERO)
    {
      if (ark_mem->interp)
      {
        retval = ARKodeGetDky(ark_mem, tout, 0, yout);
        if (retval != ARK_SUCCESS)
        {
          arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                          MSG_ARK_INTERPOLATION_FAIL, tout);
          istate = retval;
          break;
        }
        ark_mem->tretlast = *tret = tout;
      }
      else
      {
        N_VScale(ONE, ark_mem->yn, yout);
        ark_mem->tretlast = *tret = ark_mem->tcur;
      }
      ark_mem->next_h = ark_mem->hprime;
      istate          = ARK_SUCCESS;
      break;
    }

    /* In ONE_STEP mode, copy y and exit loop */
    if (itask == ARK_ONE_STEP)
    {
      istate            = ARK_SUCCESS;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->next_h = ark_mem->hprime;
      break;
    }

  } /* end looping for internal steps */

  /* stop profiler and return */
  SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
  return (istate);
}